

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

S2CellId __thiscall S2CellId::maximum_tile(S2CellId *this,S2CellId limit)

{
  bool bVar1;
  S2CellId SVar2;
  S2CellId SVar3;
  bool local_91;
  S2CellId local_70;
  S2CellId parent;
  S2CellId start;
  S2CellId id;
  S2CellId *this_local;
  S2CellId limit_local;
  
  start = (S2CellId)this->id_;
  this_local = (S2CellId *)limit.id_;
  SVar2 = range_min(&start);
  SVar3 = range_min((S2CellId *)&this_local);
  bVar1 = operator>=(SVar2,SVar3);
  if (bVar1) {
    limit_local.id_ = (uint64)this_local;
  }
  else {
    SVar3 = range_max(&start);
    bVar1 = operator>=(SVar3,(S2CellId)this_local);
    if (bVar1) {
      do {
        start = child(&start,0);
        SVar2 = range_max(&start);
        parent.id_ = (uint64)this_local;
        bVar1 = operator>=(SVar2,(S2CellId)this_local);
      } while (bVar1);
      limit_local = start;
    }
    else {
      while (bVar1 = is_face(&start), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_70 = S2CellId::parent(&start);
        SVar3 = range_min(&local_70);
        bVar1 = ::operator!=(SVar3,SVar2);
        local_91 = true;
        if (!bVar1) {
          SVar3 = range_max(&local_70);
          local_91 = operator>=(SVar3,(S2CellId)this_local);
        }
        if (local_91 != false) break;
        start.id_ = local_70.id_;
      }
      limit_local = start;
    }
  }
  return (S2CellId)limit_local.id_;
}

Assistant:

S2CellId S2CellId::maximum_tile(const S2CellId limit) const {
  S2CellId id = *this;
  S2CellId start = id.range_min();
  if (start >= limit.range_min()) return limit;

  if (id.range_max() >= limit) {
    // The cell is too large.  Shrink it.  Note that when generating coverings
    // of S2CellId ranges, this loop usually executes only once.  Also because
    // id.range_min() < limit.range_min(), we will always exit the loop by the
    // time we reach a leaf cell.
    do { id = id.child(0); } while (id.range_max() >= limit);
    return id;
  }
  // The cell may be too small.  Grow it if necessary.  Note that generally
  // this loop only iterates once.
  while (!id.is_face()) {
    S2CellId parent = id.parent();
    if (parent.range_min() != start || parent.range_max() >= limit) break;
    id = parent;
  }
  return id;
}